

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::storage_impl<$96322bb6$>::add_column
          (storage_impl<_96322bb6_> *this,table_info *ti,sqlite3 *db)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  error_category *peVar6;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  statement_finalizer finalizer;
  int prepareResult;
  sqlite3_stmt *stmt;
  __string_type query;
  stringstream ss;
  char *in_stack_fffffffffffffdf8;
  system_error *in_stack_fffffffffffffe00;
  error_code in_stack_fffffffffffffe08;
  statement_finalizer local_1e8;
  int local_1dc;
  sqlite3_stmt *local_1d8;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190;
  undefined8 local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(&local_190,"ALTER TABLE ");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 1000));
  poVar2 = std::operator<<(poVar2," ADD COLUMN ");
  poVar2 = std::operator<<(poVar2,(string *)(local_10 + 8));
  std::operator<<(poVar2,anon_var_dwarf_5f618 + 0x3fe5);
  poVar2 = std::operator<<(&local_190,(string *)(local_10 + 0x28));
  std::operator<<(poVar2,anon_var_dwarf_5f618 + 0x3fe5);
  if (*(int *)(local_10 + 0x70) != 0) {
    std::operator<<(&local_190,"PRIMARY KEY ");
  }
  if ((*(byte *)(local_10 + 0x48) & 1) != 0) {
    std::operator<<(&local_190,"NOT NULL ");
  }
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    poVar2 = std::operator<<(&local_190,"DEFAULT ");
    poVar2 = std::operator<<(poVar2,(string *)(local_10 + 0x50));
    std::operator<<(poVar2,anon_var_dwarf_5f618 + 0x3fe5);
  }
  std::__cxx11::stringstream::str();
  uVar5 = local_18;
  uVar4 = std::__cxx11::string::c_str();
  local_1dc = sqlite3_prepare_v2(uVar5,uVar4,0xffffffff,&local_1d8,0);
  if (local_1dc == 0) {
    statement_finalizer::statement_finalizer(&local_1e8,local_1d8);
    iVar1 = sqlite3_step(local_1d8);
    if (iVar1 == 0x65) {
      statement_finalizer::~statement_finalizer((statement_finalizer *)0x25f467);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return;
    }
    uVar5 = __cxa_allocate_exception(0x20);
    iVar1 = sqlite3_errcode(local_18);
    peVar6 = &get_sqlite_error_category()->super_error_category;
    std::error_code::error_code((error_code *)&stack0xfffffffffffffe08,iVar1,peVar6);
    sqlite3_errmsg(local_18);
    std::system_error::system_error
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,in_stack_fffffffffffffdf8);
    __cxa_throw(uVar5,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  uVar5 = __cxa_allocate_exception(0x20);
  iVar1 = sqlite3_errcode(local_18);
  peVar6 = &get_sqlite_error_category()->super_error_category;
  std::error_code::error_code((error_code *)&stack0xfffffffffffffdf8,iVar1,peVar6);
  sqlite3_errmsg(local_18);
  std::system_error::system_error
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,in_stack_fffffffffffffdf8);
  __cxa_throw(uVar5,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void add_column(const table_info &ti, sqlite3 *db) const {
        std::stringstream ss;
        ss << "ALTER TABLE " << this->table.name << " ADD COLUMN " << ti.name << " ";
        ss << ti.type << " ";
        if(ti.pk) {
            ss << "PRIMARY KEY ";
        }
        if(ti.notnull) {
            ss << "NOT NULL ";
        }
        if(ti.dflt_value.length()) {
            ss << "DEFAULT " << ti.dflt_value << " ";
        }
        auto query = ss.str();
        sqlite3_stmt *stmt;
        auto prepareResult = sqlite3_prepare_v2(db, query.c_str(), -1, &stmt, nullptr);
        if(prepareResult == SQLITE_OK) {
            statement_finalizer finalizer{stmt};
            if(sqlite3_step(stmt) == SQLITE_DONE) {
                //..
            } else {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        } else {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }